

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateMethodSignatures
          (ServiceGenerator *this,VirtualOrNot virtual_or_not,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  DescriptorStringView value;
  cpp *pcVar4;
  Options *options;
  Sub *local_5b8;
  basic_string_view<char,_std::char_traits<char>_> local_530;
  undefined1 local_519;
  char *local_518;
  allocator<char> local_509;
  string local_508;
  char *local_4e8;
  allocator<char> local_4d9;
  string local_4d8;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_411;
  string local_410;
  Sub *local_3f0;
  Sub local_3e8;
  Sub local_330;
  Sub local_278;
  Sub local_1c0;
  Sub local_108;
  iterator local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  undefined1 local_30 [8];
  MethodDescriptor *method;
  undefined8 uStack_20;
  int i;
  Printer *printer_local;
  ServiceGenerator *pSStack_10;
  VirtualOrNot virtual_or_not_local;
  ServiceGenerator *this_local;
  
  method._4_4_ = 0;
  uStack_20 = printer;
  printer_local._4_4_ = virtual_or_not;
  pSStack_10 = this;
  while( true ) {
    iVar1 = method._4_4_;
    uVar3 = ServiceDescriptor::method_count(this->descriptor_);
    options = (Options *)(ulong)uVar3;
    if ((int)uVar3 <= iVar1) break;
    local_30 = (undefined1  [8])ServiceDescriptor::method(this->descriptor_,method._4_4_);
    uVar2 = uStack_20;
    local_519 = 1;
    local_3f0 = &local_3e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"name",&local_411);
    value = MethodDescriptor::name_abi_cxx11_((MethodDescriptor *)local_30);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3e8,&local_410,value);
    local_3f0 = &local_330;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"input",&local_449);
    pcVar4 = (cpp *)google::protobuf::MethodDescriptor::input_type();
    QualifiedClassName_abi_cxx11_(&local_470,pcVar4,(Descriptor *)this->options_,options);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_330,&local_448,&local_470);
    local_3f0 = &local_278;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"output",&local_491);
    pcVar4 = (cpp *)google::protobuf::MethodDescriptor::output_type();
    QualifiedClassName_abi_cxx11_(&local_4b8,pcVar4,(Descriptor *)this->options_,options);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_278,&local_490,&local_4b8);
    local_3f0 = &local_1c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"virtual",&local_4d9);
    local_4e8 = "";
    if (printer_local._4_4_ == kVirtual) {
      local_4e8 = "virtual";
    }
    io::Printer::Sub::Sub<char_const*>(&local_1c0,&local_4d8,&local_4e8);
    local_3f0 = &local_108;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"override",&local_509);
    local_518 = "";
    if (printer_local._4_4_ != kVirtual) {
      local_518 = "override";
    }
    io::Printer::Sub::Sub<char_const*>(&local_108,&local_508,&local_518);
    local_519 = 0;
    local_50 = &local_3e8;
    local_48 = 5;
    v._M_len = 5;
    v._M_array = local_50;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_40._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_530,
               "\n          $virtual $void $name$(::$proto_ns$::RpcController* controller,\n                                const $input$* request,\n                                $output$* response,\n                                ::google::protobuf::Closure* done)$ override$;\n        "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (uVar2,local_40._M_allocated_capacity,local_40._8_8_,local_530._M_len,local_530._M_str
              );
    local_5b8 = (Sub *)&local_50;
    do {
      local_5b8 = local_5b8 + -1;
      io::Printer::Sub::~Sub(local_5b8);
    } while (local_5b8 != &local_3e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    method._4_4_ = method._4_4_ + 1;
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateMethodSignatures(VirtualOrNot virtual_or_not,
                                                io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
            {"virtual", virtual_or_not == kVirtual ? "virtual" : ""},
            {"override", virtual_or_not != kVirtual ? "override" : ""},
        },
        // No cc, clang-format does not format this string well due to the
        // $ override$ substitution.
        R"(
          $virtual $void $name$(::$proto_ns$::RpcController* controller,
                                const $input$* request,
                                $output$* response,
                                ::google::protobuf::Closure* done)$ override$;
        )");
  }
}